

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

void test_archive_string_conversion(void)

{
  archive *extra;
  FILE *__stream;
  size_t __n;
  FILE_conflict *fp;
  ssize_t size;
  char buff [512];
  archive_entry *ae;
  archive *a;
  char *in_stack_000004a0;
  char *in_stack_000004b0;
  archive *in_stack_fffffffffffffdc8;
  archive *entry;
  archive *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  archive *in_stack_fffffffffffffde0;
  wchar_t line;
  char *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  archive *in_stack_fffffffffffffe08;
  
  extract_reference_file((char *)buff._448_8_);
  extra = archive_read_new();
  assertion_assert((char *)in_stack_fffffffffffffde0,
                   (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
  archive_read_support_filter_all(in_stack_fffffffffffffdc8);
  assertion_equal_int(in_stack_fffffffffffffde8,(wchar_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)extra,(char *)0x13a0b8,in_stack_fffffffffffffe00);
  archive_read_support_format_raw(in_stack_fffffffffffffe08);
  assertion_equal_int(in_stack_fffffffffffffde8,(wchar_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)extra,(char *)0x13a0f7,in_stack_fffffffffffffe00);
  archive_read_open_filename
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0);
  entry = extra;
  assertion_equal_int(in_stack_fffffffffffffde8,(wchar_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)extra,(char *)0x13a142,in_stack_fffffffffffffe00);
  archive_read_next_header(in_stack_fffffffffffffdd0,(archive_entry **)entry);
  assertion_equal_int(in_stack_fffffffffffffde8,(wchar_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                      (longlong)in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
                      (longlong)extra,(char *)0x13a189,in_stack_fffffffffffffe00);
  __stream = fopen("testdata.txt","w");
  assertion_assert((char *)in_stack_fffffffffffffde0,(wchar_t)((ulong)__stream >> 0x20),
                   (wchar_t)__stream,(char *)in_stack_fffffffffffffdd0,extra);
  while( true ) {
    __n = archive_read_data(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                            in_stack_fffffffffffffdf8);
    if ((long)__n < 1) break;
    fwrite(&stack0xfffffffffffffde8,1,__n,__stream);
  }
  fclose(__stream);
  line = (wchar_t)(__n >> 0x20);
  archive_read_free((archive *)0x13a21e);
  assertion_equal_int(in_stack_fffffffffffffde8,line,(longlong)__stream,
                      (char *)in_stack_fffffffffffffdd0,0,(char *)0x13a24c,in_stack_fffffffffffffe00
                     );
  test_archive_string_normalization_nfc(in_stack_000004a0);
  test_archive_string_normalization_mac_nfd(in_stack_000004b0);
  test_archive_string_canonicalization();
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		fwrite(buff, 1, size, fp);
	fclose(fp);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
}